

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture1_IterateLevelFacesTest_IterateImages_Test::
~ktxTexture1_IterateLevelFacesTest_IterateImages_Test
          (ktxTexture1_IterateLevelFacesTest_IterateImages_Test *this)

{
  void *in_RDI;
  
  ~ktxTexture1_IterateLevelFacesTest_IterateImages_Test
            ((ktxTexture1_IterateLevelFacesTest_IterateImages_Test *)0x136dd8);
  operator_delete(in_RDI,0x1e0);
  return;
}

Assistant:

TEST_F(ktxTexture1_IterateLevelFacesTest, IterateImages) {
    ktxTexture* texture = 0;
    KTX_error_code result;
    ktxTexture1_IterateLevelFacesTest* fixture = this;

    if (ktxMemFile != NULL) {
        result = ktxTexture_CreateFromMemory(ktxMemFile, ktxMemFileLen,
                                             KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT,
                                             &texture);
        EXPECT_EQ(result, KTX_SUCCESS);
        ASSERT_TRUE(texture != NULL) << "ktxTexture_CreateFromMemory failed: "
                                     << ktxErrorString(result);

        EXPECT_EQ(ktxTexture_IterateLevelFaces(texture, iterCallback, fixture),
                  KTX_SUCCESS);
        EXPECT_EQ(iterCbCalls, mipLevels)
                  << "No. of calls to iterCallback differs from number of mip levels";
        if (texture)
            ktxTexture_Destroy(texture);
    }
}